

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

hts_idx_t * hts_idx_load_local(char *fn,int fmt)

{
  int iVar1;
  BGZF *fp;
  ssize_t sVar2;
  uint8_t *puVar3;
  ulong uVar4;
  FILE *__stream;
  size_t sVar5;
  hts_idx_t *idx;
  hts_idx_t *idx_00;
  uint8_t magic [4];
  uint32_t n;
  uint32_t x [3];
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  uint local_2c;
  
  if (fmt == 2) {
    fp = bgzf_open(fn,"r");
    if (fp == (BGZF *)0x0) {
      return (hts_idx_t *)0x0;
    }
    sVar2 = bgzf_read(fp,magic,4);
    if (((sVar2 == 4) && (magic == (uint8_t  [4])0x1494254)) &&
       (sVar2 = bgzf_read(fp,x,0x20), sVar2 == 0x20)) {
      idx_00 = hts_idx_init(x[0],2,0,0xe,5);
      idx = (hts_idx_t *)0x0;
      if (idx_00 != (hts_idx_t *)0x0) {
        idx_00->l_meta = local_2c + 0x1c;
        puVar3 = (uint8_t *)malloc((ulong)(local_2c + 0x1c));
        idx_00->meta = puVar3;
        idx = idx_00;
        if (puVar3 != (uint8_t *)0x0) {
          *(ulong *)(puVar3 + 0xc) = CONCAT44(uStack_34,uStack_38);
          *(ulong *)(puVar3 + 0x14) = CONCAT44(local_2c,uStack_30);
          *(ulong *)puVar3 = CONCAT44(x[2],x[1]);
          *(ulong *)(puVar3 + 8) = CONCAT44(uStack_38,uStack_3c);
          uVar4 = bgzf_read(fp,puVar3 + 0x1c,(ulong)local_2c);
          if ((uVar4 == local_2c) && (iVar1 = hts_idx_load_core(idx_00,fp,2), -1 < iVar1))
          goto LAB_0010c427;
        }
      }
    }
    else {
      idx = (hts_idx_t *)0x0;
    }
    bgzf_close(fp);
LAB_0010c3b8:
    hts_idx_destroy(idx);
    return (hts_idx_t *)0x0;
  }
  if (fmt == 1) {
    __stream = fopen(fn,"rb");
    if (__stream == (FILE *)0x0) {
      return (hts_idx_t *)0x0;
    }
    sVar5 = fread(magic,1,4,__stream);
    if (((sVar5 == 4) && (magic == (uint8_t  [4])0x1494142)) &&
       (sVar5 = fread(x,4,1,__stream), sVar5 == 1)) {
      idx = hts_idx_init(x[0],1,0,0xe,5);
      iVar1 = hts_idx_load_core(idx,__stream,1);
      if (-1 < iVar1) {
        fclose(__stream);
        return idx;
      }
    }
    else {
      idx = (hts_idx_t *)0x0;
    }
    fclose(__stream);
    goto LAB_0010c3b8;
  }
  if (fmt != 0) {
    abort();
  }
  fp = bgzf_open(fn,"r");
  if (fp == (BGZF *)0x0) {
    return (hts_idx_t *)0x0;
  }
  sVar2 = bgzf_read(fp,magic,4);
  if (((sVar2 == 4) && (magic == (uint8_t  [4])0x1495343)) &&
     (sVar2 = bgzf_read(fp,x,0xc), sVar2 == 0xc)) {
    uVar4 = (ulong)x[2];
    if (uVar4 == 0) {
      puVar3 = (uint8_t *)0x0;
LAB_0010c3d0:
      sVar2 = bgzf_read(fp,&n,4);
      if ((sVar2 == 4) && (idx_00 = hts_idx_init(n,0,0,x[0],x[1]), idx_00 != (hts_idx_t *)0x0)) {
        idx_00->l_meta = x[2];
        idx_00->meta = puVar3;
        puVar3 = (uint8_t *)0x0;
        iVar1 = hts_idx_load_core(idx_00,fp,0);
        if (-1 < iVar1) {
LAB_0010c427:
          bgzf_close(fp);
          return idx_00;
        }
        goto LAB_0010c381;
      }
    }
    else {
      puVar3 = (uint8_t *)malloc(uVar4);
      if (puVar3 == (uint8_t *)0x0) goto LAB_0010c37c;
      uVar4 = bgzf_read(fp,puVar3,uVar4);
      if (uVar4 == x[2]) goto LAB_0010c3d0;
    }
    idx_00 = (hts_idx_t *)0x0;
  }
  else {
LAB_0010c37c:
    idx_00 = (hts_idx_t *)0x0;
    puVar3 = (uint8_t *)0x0;
  }
LAB_0010c381:
  bgzf_close(fp);
  hts_idx_destroy(idx_00);
  free(puVar3);
  return (hts_idx_t *)0x0;
}

Assistant:

hts_idx_t *hts_idx_load_local(const char *fn, int fmt)
{
    uint8_t magic[4];
    int i, is_be;
    hts_idx_t *idx = NULL;
    is_be = ed_is_big();
    if (fmt == HTS_FMT_CSI) {
        BGZF *fp;
        uint32_t x[3], n;
        uint8_t *meta = 0;
        if ((fp = bgzf_open(fn, "r")) == 0) return NULL;
        if (bgzf_read(fp, magic, 4) != 4) goto csi_fail;
        if (memcmp(magic, "CSI\1", 4) != 0) goto csi_fail;
        if (bgzf_read(fp, x, 12) != 12) goto csi_fail;
        if (is_be) for (i = 0; i < 3; ++i) ed_swap_4p(&x[i]);
        if (x[2]) {
            if ((meta = (uint8_t*)malloc(x[2])) == NULL) goto csi_fail;
            if (bgzf_read(fp, meta, x[2]) != x[2]) goto csi_fail;
        }
        if (bgzf_read(fp, &n, 4) != 4) goto csi_fail;
        if (is_be) ed_swap_4p(&n);
        if ((idx = hts_idx_init(n, fmt, 0, x[0], x[1])) == NULL) goto csi_fail;
        idx->l_meta = x[2];
        idx->meta = meta;
        meta = NULL;
        if (hts_idx_load_core(idx, fp, HTS_FMT_CSI) < 0) goto csi_fail;
        bgzf_close(fp);
        return idx;

    csi_fail:
        bgzf_close(fp);
        hts_idx_destroy(idx);
        free(meta);
        return NULL;

    } else if (fmt == HTS_FMT_TBI) {
        BGZF *fp;
        uint32_t x[8];
        if ((fp = bgzf_open(fn, "r")) == 0) return NULL;
        if (bgzf_read(fp, magic, 4) != 4) goto tbi_fail;
        if (memcmp(magic, "TBI\1", 4) != 0) goto tbi_fail;
        if (bgzf_read(fp, x, 32) != 32) goto tbi_fail;
        if (is_be) for (i = 0; i < 8; ++i) ed_swap_4p(&x[i]);
        if ((idx = hts_idx_init(x[0], fmt, 0, 14, 5)) == NULL) goto tbi_fail;
        idx->l_meta = 28 + x[7];
        if ((idx->meta = (uint8_t*)malloc(idx->l_meta)) == NULL) goto tbi_fail;
        memcpy(idx->meta, &x[1], 28);
        if (bgzf_read(fp, idx->meta + 28, x[7]) != x[7]) goto tbi_fail;
        if (hts_idx_load_core(idx, fp, HTS_FMT_TBI) < 0) goto tbi_fail;
        bgzf_close(fp);
        return idx;

    tbi_fail:
        bgzf_close(fp);
        hts_idx_destroy(idx);
        return NULL;

    } else if (fmt == HTS_FMT_BAI) {
        uint32_t n;
        FILE *fp;
        if ((fp = fopen(fn, "rb")) == 0) return NULL;
        if (fread(magic, 1, 4, fp) != 4) goto bai_fail;
        if (memcmp(magic, "BAI\1", 4) != 0) goto bai_fail;
        if (fread(&n, 4, 1, fp) != 1) goto bai_fail;
        if (is_be) ed_swap_4p(&n);
        idx = hts_idx_init(n, fmt, 0, 14, 5);
        if (hts_idx_load_core(idx, fp, HTS_FMT_BAI) < 0) goto bai_fail;
        fclose(fp);
        return idx;

    bai_fail:
        fclose(fp);
        hts_idx_destroy(idx);
        return NULL;

    } else abort();
}